

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int are_comps_similar(opj_image_t *image)

{
  uint local_1c;
  uint i;
  opj_image_t *image_local;
  
  local_1c = 1;
  while( true ) {
    if (image->numcomps <= local_1c) {
      return 1;
    }
    if (((image->comps->dx != image->comps[local_1c].dx) ||
        (image->comps->dy != image->comps[local_1c].dy)) ||
       ((local_1c < 3 &&
        ((image->comps->prec != image->comps[local_1c].prec ||
         (image->comps->sgnd != image->comps[local_1c].sgnd)))))) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

static int are_comps_similar(opj_image_t * image)
{
    unsigned int i;
    for (i = 1; i < image->numcomps; i++) {
        if (image->comps[0].dx != image->comps[i].dx ||
                image->comps[0].dy != image->comps[i].dy ||
                (i <= 2 &&
                 (image->comps[0].prec != image->comps[i].prec ||
                  image->comps[0].sgnd != image->comps[i].sgnd))) {
            return OPJ_FALSE;
        }
    }
    return OPJ_TRUE;
}